

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::openImageFile(UEFITool *this)

{
  QString local_80;
  QFlags<QFileDialog::Option> local_68 [4];
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString path;
  UEFITool *this_local;
  
  path.d.size = (qsizetype)this;
  tr(&local_40,"Open BIOS image file",(char *)0x0,-1);
  tr(&local_58,"BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)",
     (char *)0x0,-1);
  QFlags<QFileDialog::Option>::QFlags(local_68);
  QFileDialog::getOpenFileName
            ((QWidget *)local_28,(QString *)this,(QString *)&local_40,(QString *)&this->currentDir,
             (QString *)&local_58,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_58);
  QString::~QString(&local_40);
  QString::QString(&local_80,(QString *)local_28);
  openImageFile(this,&local_80);
  QString::~QString(&local_80);
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void UEFITool::openImageFile()
{
    QString path = QFileDialog::getOpenFileName(this, tr("Open BIOS image file"), currentDir, tr("BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)"));
    openImageFile(path);
}